

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerOpenWalIfPresent(Pager *pPager)

{
  int iVar1;
  Pgno nPage;
  int isWal;
  Pgno local_10;
  int local_c;
  
  if (pPager->tempFile != '\0') {
    return 0;
  }
  iVar1 = (*pPager->pVfs->xAccess)(pPager->pVfs,pPager->zWal,0,&local_c);
  if (iVar1 == 0) {
    if (local_c == 0) {
      iVar1 = 0;
      if (pPager->journalMode == '\x05') {
        pPager->journalMode = '\0';
      }
    }
    else {
      iVar1 = pagerPagecount(pPager,&local_10);
      if (iVar1 == 0) {
        if (local_10 == 0) {
          iVar1 = (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zWal,0);
        }
        else {
          iVar1 = sqlite3PagerOpenWal(pPager,(int *)0x0);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int pagerOpenWalIfPresent(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );

  if( !pPager->tempFile ){
    int isWal;                    /* True if WAL file exists */
    rc = sqlite3OsAccess(
        pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &isWal
    );
    if( rc==SQLITE_OK ){
      if( isWal ){
        Pgno nPage;                   /* Size of the database file */

        rc = pagerPagecount(pPager, &nPage);
        if( rc ) return rc;
        if( nPage==0 ){
          rc = sqlite3OsDelete(pPager->pVfs, pPager->zWal, 0);
        }else{
          testcase( sqlite3PcachePagecount(pPager->pPCache)==0 );
          rc = sqlite3PagerOpenWal(pPager, 0);
        }
      }else if( pPager->journalMode==PAGER_JOURNALMODE_WAL ){
        pPager->journalMode = PAGER_JOURNALMODE_DELETE;
      }
    }
  }
  return rc;
}